

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O3

void png_build_8bit_table(png_structrp png_ptr,png_bytepp ptable,png_fixed_point gamma_val)

{
  png_byte *ppVar1;
  int iVar2;
  png_byte *ppVar3;
  long lVar4;
  png_byte pVar5;
  png_byte pVar7;
  png_byte pVar8;
  png_byte pVar9;
  png_byte pVar10;
  png_byte pVar11;
  png_byte pVar12;
  png_byte pVar13;
  double dVar6;
  png_byte pVar14;
  png_byte pVar15;
  png_byte pVar16;
  png_byte pVar17;
  png_byte pVar18;
  png_byte pVar19;
  png_byte pVar20;
  png_byte pVar21;
  
  ppVar3 = (png_byte *)png_malloc(png_ptr,0x100);
  *ptable = ppVar3;
  if (gamma_val - 95000U < 0x2711) {
    pVar5 = '\0';
    pVar7 = '\x01';
    pVar8 = '\x02';
    pVar9 = '\x03';
    pVar10 = '\x04';
    pVar11 = '\x05';
    pVar12 = '\x06';
    pVar13 = '\a';
    pVar14 = '\b';
    pVar15 = '\t';
    pVar16 = '\n';
    pVar17 = '\v';
    pVar18 = '\f';
    pVar19 = '\r';
    pVar20 = '\x0e';
    pVar21 = '\x0f';
    lVar4 = 0;
    do {
      ppVar1 = ppVar3 + lVar4;
      *ppVar1 = pVar5;
      ppVar1[1] = pVar7;
      ppVar1[2] = pVar8;
      ppVar1[3] = pVar9;
      ppVar1[4] = pVar10;
      ppVar1[5] = pVar11;
      ppVar1[6] = pVar12;
      ppVar1[7] = pVar13;
      ppVar1[8] = pVar14;
      ppVar1[9] = pVar15;
      ppVar1[10] = pVar16;
      ppVar1[0xb] = pVar17;
      ppVar1[0xc] = pVar18;
      ppVar1[0xd] = pVar19;
      ppVar1[0xe] = pVar20;
      ppVar1[0xf] = pVar21;
      lVar4 = lVar4 + 0x10;
      pVar5 = pVar5 + '\x10';
      pVar7 = pVar7 + '\x10';
      pVar8 = pVar8 + '\x10';
      pVar9 = pVar9 + '\x10';
      pVar10 = pVar10 + '\x10';
      pVar11 = pVar11 + '\x10';
      pVar12 = pVar12 + '\x10';
      pVar13 = pVar13 + '\x10';
      pVar14 = pVar14 + '\x10';
      pVar15 = pVar15 + '\x10';
      pVar16 = pVar16 + '\x10';
      pVar17 = pVar17 + '\x10';
      pVar18 = pVar18 + '\x10';
      pVar19 = pVar19 + '\x10';
      pVar20 = pVar20 + '\x10';
      pVar21 = pVar21 + '\x10';
    } while (lVar4 != 0x100);
  }
  else {
    lVar4 = 0;
    do {
      iVar2 = (int)lVar4;
      if (iVar2 - 1U < 0xfe) {
        dVar6 = pow((double)iVar2 / 255.0,(double)gamma_val * 1e-05);
        dVar6 = floor(dVar6 * 255.0 + 0.5);
        iVar2 = (int)dVar6;
      }
      ppVar3[lVar4] = (png_byte)iVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x100);
  }
  return;
}

Assistant:

static void
png_build_8bit_table(png_structrp png_ptr, png_bytepp ptable,
    png_fixed_point gamma_val)
{
   unsigned int i;
   png_bytep table = *ptable = (png_bytep)png_malloc(png_ptr, 256);

   if (png_gamma_significant(gamma_val) != 0)
      for (i=0; i<256; i++)
         table[i] = png_gamma_8bit_correct(i, gamma_val);

   else
      for (i=0; i<256; ++i)
         table[i] = (png_byte)(i & 0xff);
}